

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void ARM_post_printer(csh ud,cs_insn *insn,char *insn_asm,MCInst *mci)

{
  int iVar1;
  char *pcVar2;
  size_t __n;
  uint local_30;
  uint local_2c;
  uint j;
  uint i;
  MCInst *mci_local;
  char *insn_asm_local;
  cs_insn *insn_local;
  csh ud_local;
  
  if (*(int *)(ud + 0x68) == 3) {
    if (((mci->writeback & 1U) == 0) && (pcVar2 = strrchr(insn_asm,0x21), pcVar2 == (char *)0x0)) {
      if ((mci->csh->mode & CS_MODE_MICRO) == CS_MODE_ARM) {
        switch(mci->Opcode) {
        case 0x80:
        case 0x81:
        case 0x84:
        case 0x85:
        case 0x88:
        case 0x89:
        case 0x8c:
        case 0x8d:
        case 0x97:
        case 0x9a:
        case 0xa1:
        case 0xa2:
        case 0xaa:
        case 0xab:
        case 0xb2:
        case 0xb3:
        case 0xb7:
        case 0xb8:
        case 0xbc:
        case 0x180:
        case 0x181:
        case 0x184:
        case 0x185:
        case 0x188:
        case 0x189:
        case 0x18c:
        case 0x18d:
        case 0x19d:
        case 0x1a0:
        case 0x1a9:
        case 0x1aa:
        case 0x1b2:
        case 0x1b3:
        case 0x1b8:
          (insn->detail->field_6).arm.writeback = true;
          break;
        default:
        }
      }
      else {
        switch(mci->Opcode) {
        case 0x92f:
        case 0x930:
        case 0x933:
        case 0x934:
        case 0x937:
        case 0x938:
        case 0x93b:
        case 0x93c:
        case 0x943:
        case 0x944:
        case 0x94a:
        case 0x94b:
        case 0x952:
        case 0x953:
        case 0x95a:
        case 0x95b:
        case 0x962:
        case 0x963:
        case 0x96a:
        case 0x96b:
        case 0xa0e:
        case 0xa0f:
        case 0xa12:
        case 0xa13:
        case 0xa16:
        case 0xa17:
        case 0xa1a:
        case 0xa1b:
        case 0xa28:
        case 0xa29:
        case 0xa2e:
        case 0xa2f:
        case 0xa36:
        case 0xa37:
        case 0xa3d:
        case 0xa3e:
          (insn->detail->field_6).arm.writeback = true;
          break;
        default:
        }
      }
    }
    else {
      (insn->detail->field_6).arm.writeback = true;
    }
    if (((insn->detail->field_6).arm.update_flags & 1U) == 0) {
      for (local_2c = 0; local_2c < 0x1c; local_2c = local_2c + 1) {
        if (insn->id == insn_update_flgs[local_2c].id) {
          pcVar2 = insn_update_flgs[local_2c].name;
          __n = strlen(insn_update_flgs[local_2c].name);
          iVar1 = strncmp(insn_asm,pcVar2,__n);
          if (iVar1 == 0) {
            (insn->detail->field_6).arm.update_flags = true;
            local_30 = 0;
            goto LAB_00181ced;
          }
        }
      }
    }
LAB_00181d44:
    if ((insn->detail->field_6).arm64.operands[0].shift.type == ARM64_SFT_INVALID) {
      (insn->detail->field_6).arm64.operands[0].shift.type = 0xf;
    }
    if (mci->Opcode == 0xd6) {
      *(undefined4 *)&(insn->detail->field_6).x86.operands[0].field_0x4 = 1;
      (insn->detail->field_6).x86.operands[0].field_1.reg = X86_REG_CS;
      *(undefined4 *)&(insn->detail->field_6).x86.operands[0].field_0x2c = 1;
      (insn->detail->field_6).x86.operands[1].type = 10;
      (insn->detail->field_6).arm.op_count = '\x02';
    }
  }
  return;
LAB_00181ced:
  if (0x13 < local_30) goto LAB_00181d44;
  if (insn->detail->regs_write[local_30] == '\0') {
    insn->detail->regs_write[local_30] = '\x03';
    goto LAB_00181d44;
  }
  local_30 = local_30 + 1;
  goto LAB_00181ced;
}

Assistant:

void ARM_post_printer(csh ud, cs_insn *insn, char *insn_asm, MCInst *mci)
{
	if (((cs_struct *)ud)->detail != CS_OPT_ON)
		return;

	// check if this insn requests write-back
	if (mci->writeback || (strrchr(insn_asm, '!')) != NULL) {
		insn->detail->arm.writeback = true;
	} else if (mci->csh->mode & CS_MODE_THUMB) {
		// handle some special instructions with writeback
		switch(mci->Opcode) {
			default:
				break;
			case ARM_t2LDC2L_PRE:
			case ARM_t2LDC2_PRE:
			case ARM_t2LDCL_PRE:
			case ARM_t2LDC_PRE:

			case ARM_t2LDRB_PRE:
			case ARM_t2LDRD_PRE:
			case ARM_t2LDRH_PRE:
			case ARM_t2LDRSB_PRE:
			case ARM_t2LDRSH_PRE:
			case ARM_t2LDR_PRE:

			case ARM_t2STC2L_PRE:
			case ARM_t2STC2_PRE:
			case ARM_t2STCL_PRE:
			case ARM_t2STC_PRE:

			case ARM_t2STRB_PRE:
			case ARM_t2STRD_PRE:
			case ARM_t2STRH_PRE:
			case ARM_t2STR_PRE:

			case ARM_t2LDC2L_POST:
			case ARM_t2LDC2_POST:
			case ARM_t2LDCL_POST:
			case ARM_t2LDC_POST:

			case ARM_t2LDRB_POST:
			case ARM_t2LDRD_POST:
			case ARM_t2LDRH_POST:
			case ARM_t2LDRSB_POST:
			case ARM_t2LDRSH_POST:
			case ARM_t2LDR_POST:

			case ARM_t2STC2L_POST:
			case ARM_t2STC2_POST:
			case ARM_t2STCL_POST:
			case ARM_t2STC_POST:

			case ARM_t2STRB_POST:
			case ARM_t2STRD_POST:
			case ARM_t2STRH_POST:
			case ARM_t2STR_POST:
				insn->detail->arm.writeback = true;
				break;
		}
	} else {	// ARM mode
		// handle some special instructions with writeback
		switch(mci->Opcode) {
			default:
				break;
			case ARM_LDC2L_PRE:
			case ARM_LDC2_PRE:
			case ARM_LDCL_PRE:
			case ARM_LDC_PRE:

			case ARM_LDRD_PRE:
			case ARM_LDRH_PRE:
			case ARM_LDRSB_PRE:
			case ARM_LDRSH_PRE:

			case ARM_STC2L_PRE:
			case ARM_STC2_PRE:
			case ARM_STCL_PRE:
			case ARM_STC_PRE:

			case ARM_STRD_PRE:
			case ARM_STRH_PRE:

			case ARM_LDC2L_POST:
			case ARM_LDC2_POST:
			case ARM_LDCL_POST:
			case ARM_LDC_POST:

			case ARM_LDRBT_POST:
			case ARM_LDRD_POST:
			case ARM_LDRH_POST:
			case ARM_LDRSB_POST:
			case ARM_LDRSH_POST:

			case ARM_STC2L_POST:
			case ARM_STC2_POST:
			case ARM_STCL_POST:
			case ARM_STC_POST:

			case ARM_STRBT_POST:
			case ARM_STRD_POST:
			case ARM_STRH_POST:

			case ARM_LDRB_POST_IMM:
			case ARM_LDR_POST_IMM:
			case ARM_STRB_POST_IMM:
			case ARM_STR_POST_IMM:

				insn->detail->arm.writeback = true;
				break;
		}
	}

	// check if this insn requests update flags
	if (insn->detail->arm.update_flags == false) {
		// some insn still update flags, regardless of tabgen info
		unsigned int i, j;

		for (i = 0; i < ARR_SIZE(insn_update_flgs); i++) {
			if (insn->id == insn_update_flgs[i].id &&
					!strncmp(insn_asm, insn_update_flgs[i].name,
						strlen(insn_update_flgs[i].name))) {
				insn->detail->arm.update_flags = true;
				// we have to update regs_write array as well
				for (j = 0; j < ARR_SIZE(insn->detail->regs_write); j++) {
					if (insn->detail->regs_write[j] == 0) {
						insn->detail->regs_write[j] = ARM_REG_CPSR;
						break;
					}
				}
				break;
			}
		}
	}

	// instruction should not have invalid CC
	if (insn->detail->arm.cc == ARM_CC_INVALID) {
		insn->detail->arm.cc = ARM_CC_AL;
	}

	// manual fix for some special instructions
	// printf(">>> id: %u, mcid: %u\n", insn->id, mci->Opcode);
	switch(mci->Opcode) {
		default:
			break;
		case ARM_MOVPCLR:
			insn->detail->arm.operands[0].type = ARM_OP_REG;
			insn->detail->arm.operands[0].reg = ARM_REG_PC;
			insn->detail->arm.operands[1].type = ARM_OP_REG;
			insn->detail->arm.operands[1].reg = ARM_REG_LR;
			insn->detail->arm.op_count = 2;
			break;
	}
}